

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itree.c
# Opt level: O3

cell_index_t itree_find(itree_t *t,cell_index_t *end,cell_index_t start,cell_id_t id)

{
  cell_t *pcVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  
  pcVar1 = t->cell;
  uVar3 = (ulong)start;
  if (pcVar1[uVar3].id == 0xffffffff) {
    uVar2 = 0xffffffff;
    uVar4 = start;
  }
  else if (start == 0xffffffff) {
    start = 0xffffffff;
LAB_001224fa:
    uVar2 = 0xffffffff;
    uVar4 = start;
  }
  else if (pcVar1[uVar3].id == id) {
    uVar4 = 0xffffffff;
    uVar2 = start;
  }
  else {
    do {
      uVar2 = pcVar1[uVar3].sib;
      uVar3 = (ulong)uVar2;
      if (uVar3 == 0xffffffff) goto LAB_001224fa;
      uVar4 = start;
      start = uVar2;
    } while (pcVar1[uVar3].id != id);
  }
  *end = uVar4;
  return uVar2;
}

Assistant:

cell_index_t itree_find(itree_t *t,
			cell_index_t *end,
			cell_index_t start,
			cell_id_t id)
{
    cell_t *cell;
    cell_index_t i, l = NO_ID, o;
    
    cell = t->cell;

    if (cell[start].id != NO_ID) {
	for (i = start; (i != NO_ID) && (cell[i].id != id); i = cell[i].sib)
	    l = i;

	if (i != NO_ID)
	    o = i;
	else 
	    o = NULL_INDEX;
    }
    else {
	o = NULL_INDEX;
	l = start;
    }

    *end = l;

    return o;
}